

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_invert.c
# Opt level: O2

void crypto_sign_ed25519_ref10_fe_invert(int32_t *out,int32_t *z)

{
  int iVar1;
  bool bVar2;
  fe t2;
  fe t1;
  fe t3;
  fe t0;
  
  crypto_sign_ed25519_ref10_fe_sq(t0,z);
  crypto_sign_ed25519_ref10_fe_sq(t1,t0);
  crypto_sign_ed25519_ref10_fe_sq(t1,t1);
  crypto_sign_ed25519_ref10_fe_mul(t1,z,t1);
  crypto_sign_ed25519_ref10_fe_mul(t0,t0,t1);
  crypto_sign_ed25519_ref10_fe_sq(t2,t0);
  crypto_sign_ed25519_ref10_fe_mul(t1,t1,t2);
  crypto_sign_ed25519_ref10_fe_sq(t2,t1);
  iVar1 = 4;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    crypto_sign_ed25519_ref10_fe_sq(t2,t2);
  }
  crypto_sign_ed25519_ref10_fe_mul(t1,t2,t1);
  crypto_sign_ed25519_ref10_fe_sq(t2,t1);
  iVar1 = 9;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    crypto_sign_ed25519_ref10_fe_sq(t2,t2);
  }
  crypto_sign_ed25519_ref10_fe_mul(t2,t2,t1);
  crypto_sign_ed25519_ref10_fe_sq(t3,t2);
  iVar1 = 0x13;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    crypto_sign_ed25519_ref10_fe_sq(t3,t3);
  }
  crypto_sign_ed25519_ref10_fe_mul(t2,t3,t2);
  crypto_sign_ed25519_ref10_fe_sq(t2,t2);
  iVar1 = 9;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    crypto_sign_ed25519_ref10_fe_sq(t2,t2);
  }
  crypto_sign_ed25519_ref10_fe_mul(t1,t2,t1);
  crypto_sign_ed25519_ref10_fe_sq(t2,t1);
  iVar1 = 0x31;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    crypto_sign_ed25519_ref10_fe_sq(t2,t2);
  }
  crypto_sign_ed25519_ref10_fe_mul(t2,t2,t1);
  crypto_sign_ed25519_ref10_fe_sq(t3,t2);
  iVar1 = 99;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    crypto_sign_ed25519_ref10_fe_sq(t3,t3);
  }
  crypto_sign_ed25519_ref10_fe_mul(t2,t3,t2);
  crypto_sign_ed25519_ref10_fe_sq(t2,t2);
  iVar1 = 0x31;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    crypto_sign_ed25519_ref10_fe_sq(t2,t2);
  }
  crypto_sign_ed25519_ref10_fe_mul(t1,t2,t1);
  crypto_sign_ed25519_ref10_fe_sq(t1,t1);
  iVar1 = 4;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    crypto_sign_ed25519_ref10_fe_sq(t1,t1);
  }
  crypto_sign_ed25519_ref10_fe_mul(out,t1,t0);
  return;
}

Assistant:

void fe_invert(fe out,const fe z)
{
  fe t0;
  fe t1;
  fe t2;
  fe t3;
  int i;

#include "pow225521.h"

  return;
}